

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brdf_plot.cpp
# Opt level: O1

void __thiscall brdf_plot::setup_camera(brdf_plot *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  mat4 view_matrix;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3 local_98;
  float local_88;
  float fStack_84;
  ulong uStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  undefined4 uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  undefined4 uStack_5c;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3 local_50;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  *(undefined8 *)&(this->_sphere_origin).field_0 = 0;
  *(undefined8 *)((long)&(this->_sphere_origin).field_0 + 8) = 0x3f80000000000000;
  *(undefined8 *)&(this->_eye_position).field_0 = 0x3f315cacbf315cac;
  *(undefined8 *)((long)&(this->_eye_position).field_0 + 8) = 0x3f315cac;
  *(undefined8 *)((long)&(this->_eye_target).field_0 + 4) = 0;
  fVar6 = 0.0 - (this->_eye_position).field_0.field_0.x;
  fVar4 = 0.0 - (this->_eye_position).field_0.field_0.y;
  fVar5 = 0.0 - (this->_eye_position).field_0.field_0.z;
  fVar1 = fVar5 * fVar5 + fVar4 * fVar4 + fVar6 * fVar6;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = 1.0 / fVar1;
  fVar6 = fVar6 * fVar1;
  fVar4 = fVar4 * fVar1;
  fVar5 = fVar5 * fVar1;
  fVar8 = fVar4 - fVar5 * 0.0;
  fVar7 = fVar5 * 0.0 - fVar6;
  fVar2 = fVar6 * 0.0 + fVar4 * -0.0;
  fVar1 = fVar2 * fVar2 + fVar7 * fVar7 + fVar8 * fVar8;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = 1.0 / fVar1;
  local_98.field_0.x = fVar8 * fVar1;
  local_88 = fVar7 * fVar1;
  fVar1 = fVar1 * fVar2;
  local_98.field_0.y = local_88 * fVar5 - fVar1 * fVar4;
  fStack_70 = -fVar5;
  fStack_84 = fVar1 * fVar6 - local_98.field_0.x * fVar5;
  local_98.field_0.z = -fVar6;
  fVar3 = local_98.field_0.x * fVar4 - local_88 * fVar6;
  local_98.field_0.w = 0.0;
  uStack_6c = 0;
  uStack_5c = 0x3f800000;
  _local_78 = CONCAT44(fVar3,fVar1);
  uStack_80 = (ulong)(uint)fVar4 ^ 0x80000000;
  fVar2 = (this->_eye_position).field_0.field_0.x;
  fVar7 = (this->_eye_position).field_0.field_0.y;
  fVar8 = (this->_eye_position).field_0.field_0.z;
  local_68 = -(fVar1 * fVar8 + local_88 * fVar7 + local_98.field_0.x * fVar2);
  fStack_64 = -(fVar3 * fVar8 + fStack_84 * fVar7 + local_98.field_0.y * fVar2);
  fStack_60 = fVar5 * fVar8 + fVar4 * fVar7 + fVar6 * fVar2;
  glm::detail::compute_inverse<glm::mat,_4,_4,_float,_(glm::precision)0,_false>::call
            ((mat<4,_4,_float,_(glm::precision)0> *)&local_50.field_0,
             (mat<4,_4,_float,_(glm::precision)0> *)&local_98.field_0);
  *(undefined8 *)&(this->_view_matrix_inv).value[3].field_0 = local_20;
  *(undefined8 *)((long)&(this->_view_matrix_inv).value[3].field_0 + 8) = uStack_18;
  *(undefined8 *)&(this->_view_matrix_inv).value[2].field_0 = local_30;
  *(undefined8 *)((long)&(this->_view_matrix_inv).value[2].field_0 + 8) = uStack_28;
  *(undefined8 *)&(this->_view_matrix_inv).value[1].field_0 = local_40;
  *(undefined8 *)((long)&(this->_view_matrix_inv).value[1].field_0 + 8) = uStack_38;
  *(undefined8 *)&(this->_view_matrix_inv).value[0].field_0 = local_50._0_8_;
  *(undefined8 *)((long)&(this->_view_matrix_inv).value[0].field_0 + 8) = local_50._8_8_;
  return;
}

Assistant:

void brdf_plot::setup_camera()
{
  _sphere_origin = {0.0, 0.0f, 0.0f};
  _sphere_radius = 1.0f;

  _eye_position = 1.2f * glm::normalize(glm::vec3{-1.0f, 1.0f, 1.0f});
  _eye_target = {0.0f, 0.0f, 0.0f};

  glm::vec3 up_vector{0.0f, 0.0f, 1.0f};
  glm::mat4 view_matrix = glm::lookAt(_eye_position, _sphere_origin, up_vector);

  _view_matrix_inv = glm::inverse(view_matrix);
}